

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O3

char * leveldb::GetVarint32PtrFallback(char *p,char *limit,uint32_t *value)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (char *)0x0;
  if (p < limit) {
    uVar4 = 0;
    uVar6 = 0;
    pcVar5 = p + 1;
    do {
      bVar1 = pcVar5[-1];
      if (-1 < (char)bVar1) {
        *value = (uint)bVar1 << ((byte)uVar4 & 0x1f) | uVar6;
        pcVar3 = pcVar5;
        break;
      }
      if (0x15 < uVar4) break;
      uVar6 = uVar6 | (bVar1 & 0x7f) << ((byte)uVar4 & 0x1f);
      uVar4 = uVar4 + 7;
      bVar7 = pcVar5 < limit;
      pcVar5 = pcVar5 + 1;
    } while (bVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return pcVar3;
}

Assistant:

const char* GetVarint32PtrFallback(const char* p, const char* limit,
                                   uint32_t* value) {
  uint32_t result = 0;
  for (uint32_t shift = 0; shift <= 28 && p < limit; shift += 7) {
    uint32_t byte = *(reinterpret_cast<const uint8_t*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}